

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O2

void __thiscall
PossibleContentsTest_TestCombinations_Test::TestBody
          (PossibleContentsTest_TestCombinations_Test *this)

{
  PossibleContents *pPVar1;
  PossibleContents *pPVar2;
  PossibleContents *pPVar3;
  PossibleContents *b;
  PossibleContents *pPVar4;
  PossibleContents *b_00;
  PossibleContents *b_01;
  PossibleContents *pPVar5;
  PossibleContents *pPVar6;
  
  pPVar1 = &(this->super_PossibleContentsTest).none;
  assertCombination<wasm::PossibleContents>(pPVar1,pPVar1,pPVar1);
  pPVar2 = &(this->super_PossibleContentsTest).i32Zero;
  assertCombination<wasm::PossibleContents>(pPVar1,pPVar2,pPVar2);
  pPVar3 = &(this->super_PossibleContentsTest).i32Global1;
  assertCombination<wasm::PossibleContents>(pPVar1,pPVar3,pPVar3);
  pPVar6 = &(this->super_PossibleContentsTest).exactI32;
  assertCombination<wasm::PossibleContents>(pPVar1,pPVar6,pPVar6);
  b = &(this->super_PossibleContentsTest).many;
  assertCombination<wasm::PossibleContents>(pPVar1,b,b);
  assertCombination<wasm::PossibleContents>(pPVar2,pPVar2,pPVar2);
  assertCombination<wasm::PossibleContents>
            (pPVar2,&(this->super_PossibleContentsTest).i32One,pPVar6);
  assertCombination<wasm::PossibleContents>(pPVar2,&(this->super_PossibleContentsTest).f64One,b);
  assertCombination<wasm::PossibleContents>(pPVar2,pPVar3,pPVar6);
  pPVar1 = &(this->super_PossibleContentsTest).f64Global;
  assertCombination<wasm::PossibleContents>(pPVar2,pPVar1,b);
  assertCombination<wasm::PossibleContents>(pPVar2,pPVar6,pPVar6);
  pPVar4 = &(this->super_PossibleContentsTest).exactAnyref;
  assertCombination<wasm::PossibleContents>(pPVar2,pPVar4,b);
  assertCombination<wasm::PossibleContents>(pPVar2,b,b);
  assertCombination<wasm::PossibleContents>(pPVar3,pPVar3,pPVar3);
  assertCombination<wasm::PossibleContents>
            (pPVar3,&(this->super_PossibleContentsTest).i32Global2,pPVar6);
  assertCombination<wasm::PossibleContents>(pPVar3,pPVar1,b);
  assertCombination<wasm::PossibleContents>(pPVar3,pPVar6,pPVar6);
  assertCombination<wasm::PossibleContents>(pPVar3,pPVar4,b);
  assertCombination<wasm::PossibleContents>(pPVar3,b,b);
  assertCombination<wasm::PossibleContents>(pPVar6,pPVar6,pPVar6);
  assertCombination<wasm::PossibleContents>(pPVar6,pPVar4,b);
  assertCombination<wasm::PossibleContents>(pPVar6,b,b);
  assertCombination<wasm::PossibleContents>(b,b,b);
  pPVar1 = &(this->super_PossibleContentsTest).exactFuncref;
  assertCombination<wasm::PossibleContents>(pPVar1,pPVar4,b);
  pPVar3 = &(this->super_PossibleContentsTest).anyGlobal;
  assertCombination<wasm::PossibleContents>(pPVar1,pPVar3,b);
  b_00 = &(this->super_PossibleContentsTest).nonNullFunc;
  assertCombination<wasm::PossibleContents>
            (pPVar1,b_00,&(this->super_PossibleContentsTest).coneFuncref1);
  assertCombination<wasm::PossibleContents>(pPVar1,pPVar1,pPVar1);
  assertCombination<wasm::PossibleContents>
            (pPVar1,&(this->super_PossibleContentsTest).exactNonNullFuncref,pPVar1);
  pPVar1 = &(this->super_PossibleContentsTest).anyNull;
  assertCombination<wasm::PossibleContents>(pPVar1,pPVar2,b);
  assertCombination<wasm::PossibleContents>(pPVar1,pPVar1,pPVar1);
  assertCombination<wasm::PossibleContents>(pPVar1,pPVar4,pPVar4);
  pPVar2 = &(this->super_PossibleContentsTest).i31Null;
  assertCombination<wasm::PossibleContents>(pPVar1,pPVar2,pPVar1);
  b_01 = &(this->super_PossibleContentsTest).funcNull;
  assertCombination<wasm::PossibleContents>(pPVar1,b_01,b);
  pPVar5 = &(this->super_PossibleContentsTest).exactNonNullAnyref;
  assertCombination<wasm::PossibleContents>(pPVar5,pPVar5,pPVar5);
  assertCombination<wasm::PossibleContents>(pPVar1,pPVar5,pPVar4);
  assertCombination<wasm::PossibleContents>
            (pPVar1,&(this->super_PossibleContentsTest).exactNonNullI31ref,
             &(this->super_PossibleContentsTest).exactI31ref);
  pPVar4 = &(this->super_PossibleContentsTest).exactFuncSignatureType;
  assertCombination<wasm::PossibleContents>(b_00,b_01,pPVar4);
  assertCombination<wasm::PossibleContents>(pPVar4,b_01,pPVar4);
  pPVar5 = &(this->super_PossibleContentsTest).exactNonNullFuncSignatureType;
  assertCombination<wasm::PossibleContents>(pPVar5,b_01,pPVar4);
  assertCombination<wasm::PossibleContents>(b_00,pPVar4,pPVar4);
  assertCombination<wasm::PossibleContents>(b_00,pPVar5,pPVar5);
  assertCombination<wasm::PossibleContents>(b_00,pPVar6,b);
  pPVar6 = &(this->super_PossibleContentsTest).coneAnyref;
  assertCombination<wasm::PossibleContents>(pPVar3,pPVar1,pPVar6);
  assertCombination<wasm::PossibleContents>(pPVar3,pPVar2,pPVar6);
  return;
}

Assistant:

TEST_F(PossibleContentsTest, TestCombinations) {
  // None with anything else becomes the other thing.
  assertCombination(none, none, none);
  assertCombination(none, i32Zero, i32Zero);
  assertCombination(none, i32Global1, i32Global1);
  assertCombination(none, exactI32, exactI32);
  assertCombination(none, many, many);

  // i32(0) will become Many, unless the value or the type is identical.
  assertCombination(i32Zero, i32Zero, i32Zero);
  assertCombination(i32Zero, i32One, exactI32);
  assertCombination(i32Zero, f64One, many);
  assertCombination(i32Zero, i32Global1, exactI32);
  assertCombination(i32Zero, f64Global, many);
  assertCombination(i32Zero, exactI32, exactI32);
  assertCombination(i32Zero, exactAnyref, many);
  assertCombination(i32Zero, many, many);

  assertCombination(i32Global1, i32Global1, i32Global1);
  assertCombination(i32Global1, i32Global2, exactI32);
  assertCombination(i32Global1, f64Global, many);
  assertCombination(i32Global1, exactI32, exactI32);
  assertCombination(i32Global1, exactAnyref, many);
  assertCombination(i32Global1, many, many);

  assertCombination(exactI32, exactI32, exactI32);
  assertCombination(exactI32, exactAnyref, many);
  assertCombination(exactI32, many, many);

  assertCombination(many, many, many);

  // Exact references: An exact reference only stays exact when combined with
  // the same heap type (nullability may be added, but nothing else). Otherwise
  // we go to a cone type or to many.
  assertCombination(exactFuncref, exactAnyref, many);
  assertCombination(exactFuncref, anyGlobal, many);
  assertCombination(exactFuncref, nonNullFunc, coneFuncref1);
  assertCombination(exactFuncref, exactFuncref, exactFuncref);
  assertCombination(exactFuncref, exactNonNullFuncref, exactFuncref);

  // Nulls.

  assertCombination(anyNull, i32Zero, many);
  assertCombination(anyNull, anyNull, anyNull);
  assertCombination(anyNull, exactAnyref, exactAnyref);

  // Two nulls go to the lub.
  assertCombination(anyNull, i31Null, anyNull);

  // Incompatible nulls go to Many.
  assertCombination(anyNull, funcNull, many);

  assertCombination(exactNonNullAnyref, exactNonNullAnyref, exactNonNullAnyref);

  // If one is a null and the other is not, it makes the one that is not a
  // null be a nullable type - but keeps the heap type of the other (since the
  // type of the null does not matter, all nulls compare equal).
  assertCombination(anyNull, exactNonNullAnyref, exactAnyref);
  assertCombination(anyNull, exactNonNullI31ref, exactI31ref);

  // Funcrefs

  // A function reference + a null becomes an exact type (of that sig), plus
  // nullability.
  assertCombination(nonNullFunc, funcNull, exactFuncSignatureType);
  assertCombination(exactFuncSignatureType, funcNull, exactFuncSignatureType);
  assertCombination(
    exactNonNullFuncSignatureType, funcNull, exactFuncSignatureType);
  assertCombination(
    nonNullFunc, exactFuncSignatureType, exactFuncSignatureType);
  assertCombination(
    nonNullFunc, exactNonNullFuncSignatureType, exactNonNullFuncSignatureType);
  assertCombination(nonNullFunc, exactI32, many);

  // Globals vs nulls. The result is either the global or a null, so all we can
  // say is that it is something of the global's type, or a null: a cone.

  assertCombination(anyGlobal, anyNull, coneAnyref);
  assertCombination(anyGlobal, i31Null, coneAnyref);
}